

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

int __thiscall PInt::GetStoreOp(PInt *this)

{
  int iVar1;
  
  iVar1 = *(int *)&this->field_0x24;
  if (iVar1 == 4) {
    return 0x22;
  }
  if (iVar1 != 2) {
    if (iVar1 == 1) {
      return 0x1e;
    }
    __assert_fail("0 && \"Unhandled integer size\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                  ,0x430,"virtual int PInt::GetStoreOp() const");
  }
  return 0x20;
}

Assistant:

int PInt::GetStoreOp() const
{
	if (Size == 4)
	{
		return OP_SW;
	}
	else if (Size == 1)
	{
		return OP_SB;
	}
	else if (Size == 2)
	{
		return OP_SH;
	}
	else
	{
		assert(0 && "Unhandled integer size");
		return OP_NOP;
	}
}